

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O2

uint LZ4HC_reverseCountPattern(BYTE *ip,BYTE *iLow,U32 pattern)

{
  BYTE BVar1;
  long lVar2;
  BYTE *pBVar3;
  long lVar4;
  U32 pattern_local;
  
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    if (ip + lVar4 < iLow + 4) break;
    lVar2 = lVar4 + -4;
  } while (*(U32 *)(ip + lVar4 + -4) == pattern);
  pBVar3 = (BYTE *)((long)&pattern_local + 3);
  do {
    lVar2 = lVar4;
    if (ip + lVar2 <= iLow) break;
    BVar1 = *pBVar3;
    lVar4 = lVar2 + -1;
    pBVar3 = pBVar3 + -1;
  } while (ip[lVar2 + -1] == BVar1);
  return -(int)lVar2;
}

Assistant:

static unsigned
LZ4HC_reverseCountPattern(const BYTE* ip, const BYTE* const iLow, U32 pattern)
{
    const BYTE* const iStart = ip;

    while (likely(ip >= iLow+4)) {
        if (LZ4_read32(ip-4) != pattern) break;
        ip -= 4;
    }
    {   const BYTE* bytePtr = (const BYTE*)(&pattern) + 3; /* works for any endianess */
        while (likely(ip>iLow)) {
            if (ip[-1] != *bytePtr) break;
            ip--; bytePtr--;
    }   }
    return (unsigned)(iStart - ip);
}